

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void SHA1_transform(ON__UINT32 *state,ON__UINT8 *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  
  uVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  uVar6 = *(uint *)block;
  uVar5 = *(uint *)(block + 4);
  uVar15 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar7 = (uVar1 << 5 | uVar1 >> 0x1b) + state[4] + uVar15 + ((uVar4 ^ uVar3) & uVar2 ^ uVar4) +
          0x5a827999;
  uVar9 = uVar2 << 0x1e | uVar2 >> 2;
  uVar22 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar17 = ((uVar9 ^ uVar3) & uVar1 ^ uVar3) + uVar4 + uVar22 + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar12 = uVar1 << 0x1e | uVar1 >> 2;
  uVar6 = *(uint *)(block + 8);
  uVar5 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar23 = ((uVar9 ^ uVar12) & uVar7 ^ uVar9) + uVar5 + uVar3 + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar8 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar6 = *(uint *)(block + 0xc);
  uVar21 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar9 + uVar21 + ((uVar8 ^ uVar12) & uVar17 ^ uVar12) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = *(uint *)(block + 0x10);
  uVar7 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar13 = uVar12 + uVar7 + ((uVar18 ^ uVar8) & uVar23 ^ uVar8) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = *(uint *)(block + 0x14);
  uVar9 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar12 = uVar8 + uVar9 + ((uVar24 ^ uVar18) & uVar17 ^ uVar18) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar6 = *(uint *)(block + 0x18);
  uVar8 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar23 = uVar18 + uVar8 + ((uVar17 ^ uVar24) & uVar13 ^ uVar24) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar6 = *(uint *)(block + 0x1c);
  uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar18 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar25 = uVar24 + uVar10 + ((uVar13 ^ uVar17) & uVar12 ^ uVar17) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = *(uint *)(block + 0x20);
  uVar12 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar24 = uVar17 + uVar12 + ((uVar18 ^ uVar13) & uVar23 ^ uVar13) + 0x5a827999 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar19 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = *(uint *)(block + 0x24);
  uVar17 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar14 = uVar13 + uVar17 + ((uVar19 ^ uVar18) & uVar25 ^ uVar18) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar6 = *(uint *)(block + 0x28);
  uVar13 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar23 = uVar18 + uVar13 + ((uVar26 ^ uVar19) & uVar24 ^ uVar19) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar6 = *(uint *)(block + 0x2c);
  uVar11 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar25 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar14 = uVar19 + uVar11 + ((uVar24 ^ uVar26) & uVar14 ^ uVar26) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = *(uint *)(block + 0x30);
  uVar18 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar27 = uVar26 + uVar18 + ((uVar25 ^ uVar24) & uVar23 ^ uVar24) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = *(uint *)(block + 0x34);
  uVar30 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar24 = uVar24 + uVar30 + ((uVar23 ^ uVar25) & uVar14 ^ uVar25) + 0x5a827999 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar26 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar6 = *(uint *)(block + 0x38);
  uVar19 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar14 = uVar25 + uVar19 + ((uVar26 ^ uVar23) & uVar27 ^ uVar23) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = *(uint *)(block + 0x3c);
  uVar28 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar27 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar24 = uVar23 + uVar27 + ((uVar28 ^ uVar26) & uVar24 ^ uVar26) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar6 = uVar12 ^ uVar30 ^ uVar15 ^ uVar5;
  uVar23 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar20 = uVar26 + uVar23 + ((uVar25 ^ uVar28) & uVar14 ^ uVar28) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = uVar17 ^ uVar19 ^ uVar22 ^ uVar21;
  uVar26 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar14 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar22 = uVar28 + uVar14 + ((uVar26 ^ uVar25) & uVar24 ^ uVar25) + 0x5a827999 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar6 = uVar13 ^ uVar27 ^ uVar5 ^ uVar7;
  uVar5 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar15 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar24 = uVar25 + uVar15 + ((uVar5 ^ uVar26) & uVar20 ^ uVar26) + 0x5a827999 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar6 = uVar21 ^ uVar9 ^ uVar11 ^ uVar23;
  uVar25 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar26 = uVar26 + uVar25 + ((uVar20 ^ uVar5) & uVar22 ^ uVar5) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar6 = uVar7 ^ uVar8 ^ uVar18 ^ uVar14;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar7 = uVar5 + uVar6 + (uVar22 ^ uVar20 ^ uVar24) + 0x6ed9eba1 + (uVar26 * 0x20 | uVar26 >> 0x1b)
  ;
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar5 = uVar9 ^ uVar10 ^ uVar30 ^ uVar15;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar21 = uVar20 + uVar5 + (uVar24 ^ uVar22 ^ uVar26) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar9 = uVar8 ^ uVar12 ^ uVar19 ^ uVar25;
  uVar20 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar28 = uVar22 + uVar20 + (uVar26 ^ uVar24 ^ uVar7) + 0x6ed9eba1 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar8 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar10 ^ uVar17 ^ uVar27 ^ uVar6;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar22 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar24 = uVar24 + uVar7 + (uVar8 ^ uVar26 ^ uVar21) + 0x6ed9eba1 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar9 = uVar12 ^ uVar13 ^ uVar23 ^ uVar5;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar10 = uVar26 + uVar9 + (uVar22 ^ uVar8 ^ uVar28) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar12 = uVar17 ^ uVar11 ^ uVar14 ^ uVar20;
  uVar21 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar8 + uVar21 + (uVar29 ^ uVar22 ^ uVar24) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar17 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar8 = uVar13 ^ uVar18 ^ uVar15 ^ uVar7;
  uVar28 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar26 = uVar22 + uVar28 + (uVar17 ^ uVar29 ^ uVar10) + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar8 = uVar11 ^ uVar30 ^ uVar25 ^ uVar9;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar24 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar11 = uVar29 + uVar8 + (uVar13 ^ uVar17 ^ uVar12) + 0x6ed9eba1 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar12 = uVar18 ^ uVar19 ^ uVar6 ^ uVar21;
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar18 = uVar17 + uVar12 + (uVar24 ^ uVar13 ^ uVar26) + 0x6ed9eba1 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar17 = uVar30 ^ uVar27 ^ uVar5 ^ uVar28;
  uVar30 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar10 = uVar13 + uVar30 + (uVar26 ^ uVar24 ^ uVar11) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar22 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar17 = uVar19 ^ uVar23 ^ uVar20 ^ uVar8;
  uVar13 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar24 + uVar13 + (uVar22 ^ uVar26 ^ uVar18) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar24 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar27 ^ uVar14 ^ uVar7 ^ uVar12;
  uVar19 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar11 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar10 = uVar26 + uVar19 + (uVar24 ^ uVar22 ^ uVar10) + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar18 = uVar23 ^ uVar15 ^ uVar9 ^ uVar30;
  uVar26 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar27 = uVar22 + uVar26 + (uVar11 ^ uVar24 ^ uVar17) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar14 ^ uVar25 ^ uVar21 ^ uVar13;
  uVar14 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar23 = uVar24 + uVar14 + (uVar18 ^ uVar11 ^ uVar10) + 0x6ed9eba1 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar17 = uVar15 ^ uVar6 ^ uVar28 ^ uVar19;
  uVar29 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar24 = uVar11 + uVar29 + (uVar10 ^ uVar18 ^ uVar27) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar15 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar17 = uVar25 ^ uVar5 ^ uVar8 ^ uVar26;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar25 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar18 = uVar18 + uVar17 + (uVar15 ^ uVar10 ^ uVar23) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = uVar6 ^ uVar20 ^ uVar12 ^ uVar14;
  uVar11 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar10 = uVar10 + uVar11 + (uVar25 ^ uVar15 ^ uVar24) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar23 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar6 = uVar5 ^ uVar7 ^ uVar30 ^ uVar29;
  uVar22 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar27 = uVar15 + uVar22 + (uVar23 ^ uVar25 ^ uVar18) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar24 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = uVar20 ^ uVar9 ^ uVar13 ^ uVar17;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar25 = uVar25 + uVar6 + (uVar24 ^ uVar23 ^ uVar10) + 0x6ed9eba1 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar15 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar5 = uVar7 ^ uVar21 ^ uVar19 ^ uVar11;
  uVar18 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar20 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar7 = uVar23 + uVar18 + (uVar15 ^ uVar24 ^ uVar27) + 0x6ed9eba1 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar5 = uVar9 ^ uVar28 ^ uVar26 ^ uVar22;
  uVar23 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar5 = uVar24 + uVar23 + (uVar25 & uVar20 | (uVar25 | uVar20) & uVar15) + -0x70e44324 +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar9 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar24 = uVar21 ^ uVar8 ^ uVar14 ^ uVar6;
  uVar10 = uVar24 << 1 | (uint)((int)uVar24 < 0);
  uVar25 = uVar15 + uVar10 + (uVar7 & uVar9 | (uVar7 | uVar9) & uVar20) + -0x70e44324 +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar24 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar28 ^ uVar12 ^ uVar29 ^ uVar18;
  uVar15 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar27 = uVar20 + uVar15 + (uVar5 & uVar24 | (uVar5 | uVar24) & uVar9) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar7 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar8 ^ uVar30 ^ uVar17 ^ uVar23;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar8 = uVar9 + uVar5 + (uVar25 & uVar7 | (uVar25 | uVar7) & uVar24) + -0x70e44324 +
          (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar9 = uVar12 ^ uVar13 ^ uVar11 ^ uVar10;
  uVar20 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar24 = uVar24 + uVar20 + (uVar27 & uVar25 | (uVar27 | uVar25) & uVar7) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar21 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar9 = uVar30 ^ uVar19 ^ uVar22 ^ uVar15;
  uVar30 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar7 + uVar30 + (uVar8 & uVar21 | (uVar8 | uVar21) & uVar25) + -0x70e44324 +
          (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar13 ^ uVar26 ^ uVar6 ^ uVar5;
  uVar12 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar27 = uVar25 + uVar12 + (uVar24 & uVar8 | (uVar24 | uVar8) & uVar21) + -0x70e44324 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar7 = uVar19 ^ uVar14 ^ uVar18 ^ uVar20;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar21 = uVar21 + uVar7 + (uVar9 & uVar25 | (uVar9 | uVar25) & uVar8) + -0x70e44324 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar13 = uVar26 ^ uVar29 ^ uVar23 ^ uVar30;
  uVar19 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar13 = uVar8 + uVar19 + (uVar27 & uVar9 | (uVar27 | uVar9) & uVar25) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar26 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar8 = uVar14 ^ uVar17 ^ uVar10 ^ uVar12;
  uVar24 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar25 = uVar25 + uVar24 + (uVar21 & uVar26 | (uVar21 | uVar26) & uVar9) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar8 = uVar29 ^ uVar11 ^ uVar15 ^ uVar7;
  uVar28 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar8 = uVar9 + uVar28 + (uVar13 & uVar21 | (uVar13 | uVar21) & uVar26) + -0x70e44324 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar9 = uVar17 ^ uVar22 ^ uVar5 ^ uVar19;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar27 = uVar26 + uVar9 + (uVar25 & uVar14 | (uVar25 | uVar14) & uVar21) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar17 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar13 = uVar11 ^ uVar6 ^ uVar20 ^ uVar24;
  uVar26 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar21 = uVar21 + uVar26 + (uVar8 & uVar17 | (uVar8 | uVar17) & uVar14) + -0x70e44324 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar13 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar8 = uVar22 ^ uVar18 ^ uVar30 ^ uVar28;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar14 = uVar14 + uVar8 + (uVar27 & uVar13 | (uVar27 | uVar13) & uVar17) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar11 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar6 = uVar6 ^ uVar23 ^ uVar12 ^ uVar9;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar25 = uVar17 + uVar6 + (uVar21 & uVar11 | (uVar21 | uVar11) & uVar13) + -0x70e44324 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar27 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = uVar18 ^ uVar10 ^ uVar7 ^ uVar26;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar18 = uVar13 + uVar17 + (uVar14 & uVar27 | (uVar14 | uVar27) & uVar11) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar13 = uVar23 ^ uVar15 ^ uVar19 ^ uVar8;
  uVar13 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar11 = uVar11 + uVar13 + (uVar25 & uVar14 | (uVar25 | uVar14) & uVar27) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar23 = uVar10 ^ uVar5 ^ uVar24 ^ uVar6;
  uVar21 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar22 = uVar27 + uVar21 + (uVar18 & uVar25 | (uVar18 | uVar25) & uVar14) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar23 = uVar15 ^ uVar20 ^ uVar28 ^ uVar17;
  uVar10 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar23 = uVar14 + uVar10 + (uVar11 & uVar18 | (uVar11 | uVar18) & uVar25) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar27 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar5 = uVar5 ^ uVar30 ^ uVar9 ^ uVar13;
  uVar11 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar5 = uVar25 + uVar11 + (uVar22 & uVar27 | (uVar22 | uVar27) & uVar18) + -0x70e44324 +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar14 = uVar20 ^ uVar12 ^ uVar26 ^ uVar21;
  uVar15 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar18 = uVar18 + uVar15 + (uVar22 ^ uVar27 ^ uVar23) + -0x359d3e2a +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar14 = uVar30 ^ uVar7 ^ uVar8 ^ uVar10;
  uVar30 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar14 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar25 = uVar27 + uVar30 + (uVar23 ^ uVar22 ^ uVar5) + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar5 = uVar12 ^ uVar19 ^ uVar6 ^ uVar11;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar20 = uVar22 + uVar5 + (uVar14 ^ uVar23 ^ uVar18) + -0x359d3e2a +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar12 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar7 = uVar7 ^ uVar24 ^ uVar17 ^ uVar15;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar23 = uVar23 + uVar7 + (uVar12 ^ uVar14 ^ uVar25) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar27 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar18 = uVar19 ^ uVar28 ^ uVar13 ^ uVar30;
  uVar25 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar14 = uVar14 + uVar25 + (uVar27 ^ uVar12 ^ uVar20) + -0x359d3e2a +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar19 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar18 = uVar24 ^ uVar9 ^ uVar21 ^ uVar5;
  uVar18 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar12 = uVar12 + uVar18 + (uVar19 ^ uVar27 ^ uVar23) + -0x359d3e2a +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar23 = uVar28 ^ uVar26 ^ uVar10 ^ uVar7;
  uVar22 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar27 = uVar27 + uVar22 + (uVar24 ^ uVar19 ^ uVar14) + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar23 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar9 = uVar9 ^ uVar8 ^ uVar11 ^ uVar25;
  uVar14 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar28 = uVar19 + uVar14 + (uVar23 ^ uVar24 ^ uVar12) + -0x359d3e2a +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar9 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar26 ^ uVar6 ^ uVar15 ^ uVar18;
  uVar19 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar24 + uVar19 + (uVar9 ^ uVar23 ^ uVar27) + -0x359d3e2a +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar20 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar8 = uVar8 ^ uVar17 ^ uVar30 ^ uVar22;
  uVar26 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar23 = uVar23 + uVar26 + (uVar20 ^ uVar9 ^ uVar28) + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar6 = uVar6 ^ uVar13 ^ uVar5 ^ uVar14;
  uVar24 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar9 = uVar9 + uVar24 + (uVar29 ^ uVar20 ^ uVar12) + -0x359d3e2a +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar8 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar6 = uVar17 ^ uVar21 ^ uVar7 ^ uVar19;
  uVar27 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar17 = uVar20 + uVar27 + (uVar8 ^ uVar29 ^ uVar23) + -0x359d3e2a +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar12 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = uVar13 ^ uVar10 ^ uVar25 ^ uVar26;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar28 = uVar29 + uVar6 + (uVar12 ^ uVar8 ^ uVar9) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar13 = uVar21 ^ uVar11 ^ uVar18 ^ uVar24;
  uVar23 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar8 = uVar8 + uVar23 + (uVar9 ^ uVar12 ^ uVar17) + -0x359d3e2a +
          (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar20 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar10 ^ uVar15 ^ uVar22 ^ uVar27;
  uVar13 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar12 + uVar13 + (uVar20 ^ uVar9 ^ uVar28) + -0x359d3e2a +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar10 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar6 = uVar11 ^ uVar30 ^ uVar14 ^ uVar6;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar9 = uVar9 + uVar6 + (uVar10 ^ uVar20 ^ uVar8) + -0x359d3e2a + (uVar17 * 0x20 | uVar17 >> 0x1b)
  ;
  uVar23 = uVar15 ^ uVar5 ^ uVar19 ^ uVar23;
  uVar12 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar8 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar23 = uVar20 + uVar8 + (uVar12 ^ uVar10 ^ uVar17) + -0x359d3e2a +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar13 = uVar30 ^ uVar7 ^ uVar26 ^ uVar13;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar13 = (uVar13 << 1 | (uint)((int)uVar13 < 0)) + uVar10 + (uVar17 ^ uVar12 ^ uVar9) +
           -0x359d3e2a + (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = uVar25 ^ uVar5 ^ uVar24 ^ uVar6;
  uVar5 = uVar9 * 0x40000000 | uVar9 >> 2;
  iVar16 = (uVar6 << 1 | (uint)((int)uVar6 < 0)) + uVar12 + (uVar5 ^ uVar17 ^ uVar23) +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar8 = uVar18 ^ uVar7 ^ uVar27 ^ uVar8;
  uVar7 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = iVar16 + 0xca62c1d6;
  *state = (uVar8 << 1 | (uint)((int)uVar8 < 0)) + uVar1 + uVar17 + (uVar7 ^ uVar5 ^ uVar13) +
           -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
  state[1] = uVar2 + iVar16 + 0xca62c1d6;
  state[2] = (uVar13 * 0x40000000 | uVar13 >> 2) + uVar3;
  state[3] = uVar7 + uVar4;
  state[4] = uVar5 + state[4];
  return;
}

Assistant:

static void SHA1_transform(ON__UINT32 state[5], const ON__UINT8 block[64])
{
	ON__UINT32 a = state[0], b = state[1], c = state[2], d = state[3], e = state[4];
  ON__UINT32 workspace16[16];

	memcpy(workspace16, block, 64);

	// 4 rounds of 20 operations each, loop unrolled
	S_R0(a,b,c,d,e, 0); S_R0(e,a,b,c,d, 1); S_R0(d,e,a,b,c, 2); S_R0(c,d,e,a,b, 3);
	S_R0(b,c,d,e,a, 4); S_R0(a,b,c,d,e, 5); S_R0(e,a,b,c,d, 6); S_R0(d,e,a,b,c, 7);
	S_R0(c,d,e,a,b, 8); S_R0(b,c,d,e,a, 9); S_R0(a,b,c,d,e,10); S_R0(e,a,b,c,d,11);
	S_R0(d,e,a,b,c,12); S_R0(c,d,e,a,b,13); S_R0(b,c,d,e,a,14); S_R0(a,b,c,d,e,15);
	S_R1(e,a,b,c,d,16); S_R1(d,e,a,b,c,17); S_R1(c,d,e,a,b,18); S_R1(b,c,d,e,a,19);
	S_R2(a,b,c,d,e,20); S_R2(e,a,b,c,d,21); S_R2(d,e,a,b,c,22); S_R2(c,d,e,a,b,23);
	S_R2(b,c,d,e,a,24); S_R2(a,b,c,d,e,25); S_R2(e,a,b,c,d,26); S_R2(d,e,a,b,c,27);
	S_R2(c,d,e,a,b,28); S_R2(b,c,d,e,a,29); S_R2(a,b,c,d,e,30); S_R2(e,a,b,c,d,31);
	S_R2(d,e,a,b,c,32); S_R2(c,d,e,a,b,33); S_R2(b,c,d,e,a,34); S_R2(a,b,c,d,e,35);
	S_R2(e,a,b,c,d,36); S_R2(d,e,a,b,c,37); S_R2(c,d,e,a,b,38); S_R2(b,c,d,e,a,39);
	S_R3(a,b,c,d,e,40); S_R3(e,a,b,c,d,41); S_R3(d,e,a,b,c,42); S_R3(c,d,e,a,b,43);
	S_R3(b,c,d,e,a,44); S_R3(a,b,c,d,e,45); S_R3(e,a,b,c,d,46); S_R3(d,e,a,b,c,47);
	S_R3(c,d,e,a,b,48); S_R3(b,c,d,e,a,49); S_R3(a,b,c,d,e,50); S_R3(e,a,b,c,d,51);
	S_R3(d,e,a,b,c,52); S_R3(c,d,e,a,b,53); S_R3(b,c,d,e,a,54); S_R3(a,b,c,d,e,55);
	S_R3(e,a,b,c,d,56); S_R3(d,e,a,b,c,57); S_R3(c,d,e,a,b,58); S_R3(b,c,d,e,a,59);
	S_R4(a,b,c,d,e,60); S_R4(e,a,b,c,d,61); S_R4(d,e,a,b,c,62); S_R4(c,d,e,a,b,63);
	S_R4(b,c,d,e,a,64); S_R4(a,b,c,d,e,65); S_R4(e,a,b,c,d,66); S_R4(d,e,a,b,c,67);
	S_R4(c,d,e,a,b,68); S_R4(b,c,d,e,a,69); S_R4(a,b,c,d,e,70); S_R4(e,a,b,c,d,71);
	S_R4(d,e,a,b,c,72); S_R4(c,d,e,a,b,73); S_R4(b,c,d,e,a,74); S_R4(a,b,c,d,e,75);
	S_R4(e,a,b,c,d,76); S_R4(d,e,a,b,c,77); S_R4(c,d,e,a,b,78); S_R4(b,c,d,e,a,79);

	// Add the working vars back into state
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
}